

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator**,std::vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>>>
               (__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                begin,__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                      end)

{
  MessageGenerator *this;
  
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    this = *begin._M_current;
    if (this != (MessageGenerator *)0x0) {
      compiler::objectivec::MessageGenerator::~MessageGenerator(this);
    }
    operator_delete(this,0xe0);
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}